

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  AST *pAVar1;
  Address AVar2;
  bool bVar3;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view postfix_02;
  string_view postfix_03;
  string_view postfix_04;
  string_view postfix_05;
  string_view postfix_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string_view first_indent;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  string_view first_indent_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  Block *pBVar4;
  value_type *pvVar5;
  bool bVar6;
  Enum EVar7;
  uint32_t __val;
  reference n_00;
  value_type *pvVar8;
  string *psVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  ConstExpr *pCVar12;
  uint64_t uVar13;
  VarExpr<(wabt::ExprType)24> *ve;
  VarExpr<(wabt::ExprType)20> *ve_00;
  VarExpr<(wabt::ExprType)25> *ve_01;
  VarExpr<(wabt::ExprType)21> *ve_02;
  VarExpr<(wabt::ExprType)26> *ve_03;
  const_reference pvVar14;
  IfExpr *pIVar15;
  reference this_00;
  size_type sVar16;
  size_t sVar17;
  size_t sVar18;
  reference pvVar19;
  BlockExprBase<(wabt::ExprType)8> *pBVar20;
  BlockExprBase<(wabt::ExprType)27> *pBVar21;
  vector<wabt::Var,_std::allocator<wabt::Var>_> *this_01;
  VarExpr<(wabt::ExprType)12> *pVVar22;
  VarExpr<(wabt::ExprType)40> *pVVar23;
  OpcodeExpr<(wabt::ExprType)18> *pOVar24;
  OpcodeExpr<(wabt::ExprType)58> *pOVar25;
  char *pcVar26;
  uint *puVar27;
  char (*in_R8) [4];
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  string_view y;
  string_view y_00;
  string_view sVar28;
  string_view y_01;
  string_view y_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1008;
  string *local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec0;
  string *local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e78;
  string *local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e18;
  string *local_df8;
  basic_string_view<char,_std::char_traits<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  string_view local_da0;
  Enum local_d8c;
  string local_d88;
  Enum local_d64;
  string local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  Precedence local_d1c;
  undefined1 local_d18 [4];
  Precedence precedence;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  iterator local_cd0;
  size_type local_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cc0;
  string local_ca8;
  char *local_c88;
  char *local_c80;
  string local_c78;
  undefined1 local_c58 [8];
  string c_2;
  CodeMetadataExpr *cme;
  char *local_c28;
  string_view local_c20;
  string_view local_c10;
  string_view local_c00;
  string_view local_bf0;
  string_view local_be0;
  reference local_bd0;
  Var *v;
  const_iterator __end3;
  const_iterator __begin3;
  VarVector *__range3;
  string local_ba8 [8];
  string ts;
  BrTableExpr *bte;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  iterator local_b58;
  size_type local_b50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b48;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b2a;
  allocator<char> local_b29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  iterator local_b08;
  size_type local_b00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_af8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ada;
  allocator<char> local_ad9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  iterator local_ab8;
  size_type local_ab0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_aa8;
  basic_string_view<char,_std::char_traits<char>_> local_a90;
  string_view local_a80;
  basic_string_view<char,_std::char_traits<char>_> local_a70;
  string_view local_a60;
  string_view local_a50;
  string_view local_a40;
  string local_a30;
  string_view local_a10;
  string_view local_a00;
  char *local_9f0;
  char *jmp;
  VarExpr<(wabt::ExprType)10> *bie;
  string_view local_9d8;
  string_view local_9c8;
  string local_9b8;
  iterator local_998;
  size_type local_990;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_988;
  VarExpr<(wabt::ExprType)9> *local_970;
  VarExpr<(wabt::ExprType)9> *be_1;
  value_type local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_940;
  string_view local_938;
  string_view local_928;
  string local_918;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8f8;
  const_iterator local_8f0;
  basic_string_view<char,_std::char_traits<char>_> local_8e8;
  string *local_8d8;
  Block *block;
  value_type *val_1;
  value_type local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a0;
  allocator<char> local_891;
  value_type local_890;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_870;
  const_iterator local_868;
  string_view local_860;
  string_view local_850;
  string_view local_840;
  string local_830;
  reference local_810;
  value_type *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  iterator local_7e0;
  size_type local_7d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d0;
  string local_7b8;
  string local_798;
  undefined1 local_778 [8];
  string s_1;
  value_type local_750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_730;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_728;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_720;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_718;
  string_view local_710;
  allocator<char> local_6f9;
  value_type local_6f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_6d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c0;
  string_view local_6b8;
  size_t local_6a8;
  size_t local_6a0;
  undefined1 local_698 [8];
  string_view if_start;
  size_t width;
  bool multiline;
  value_type *ifs;
  value_type *thenp;
  Value *elsep;
  IfExpr *ife;
  Type local_644;
  Opcode local_63c;
  LoadStoreExpr<(wabt::ExprType)49> *local_638;
  LoadStoreExpr<(wabt::ExprType)49> *se;
  Opcode local_624;
  LoadStoreExpr<(wabt::ExprType)23> *local_620;
  LoadStoreExpr<(wabt::ExprType)23> *le;
  char *local_610;
  Enum local_604;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string_view local_5c0;
  OpcodeExpr<(wabt::ExprType)63> *local_5b0;
  OpcodeExpr<(wabt::ExprType)63> *ue;
  string local_5a0;
  string_view local_580;
  OpcodeExpr<(wabt::ExprType)16> *local_570;
  OpcodeExpr<(wabt::ExprType)16> *ce;
  char *local_560;
  Precedence local_558;
  Enum local_554;
  Precedence prec;
  string opcs;
  OpcodeExpr<(wabt::ExprType)7> *be;
  VarExpr<(wabt::ExprType)26> *te;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  iterator local_4f8;
  size_type local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c9;
  string local_4c8;
  iterator local_4a8;
  size_type local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  uint64_t local_480;
  double local_478;
  double d;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  iterator local_428;
  size_type local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  uint32_t local_3fc;
  float local_3f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f1;
  float f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  iterator local_3b0;
  size_type local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_381;
  string local_380;
  iterator local_360;
  size_type local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  Type local_338;
  Const *local_330;
  Const *c_1;
  char *local_320;
  Type local_318;
  string local_310;
  string local_2f0;
  string local_2d0;
  string_view local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  string_view local_290;
  string_view local_280;
  string local_270;
  string_view local_250;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_239;
  Type local_238;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  iterator local_1d0;
  size_type local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  string_view local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  reference local_168;
  value_type *s;
  size_t i_1;
  undefined1 local_13a;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_139;
  string local_138;
  iterator local_118;
  size_type local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined4 local_ec;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string_view local_d8;
  string local_c8;
  uint local_a8;
  allocator<char> local_a1;
  Index i;
  string decls;
  Node *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *__range2;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  Node *parent_local;
  Node *n_local;
  Decompiler *this_local;
  Value *stats;
  
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)parent;
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::vector
            ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2)
  ;
  __end2 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&n->children);
  c = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&n->children);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                                     *)&c), bVar6) {
    n_00 = __gnu_cxx::
           __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
           ::operator*(&__end2);
    DecompileExpr((Value *)((long)&decls.field_2 + 8),this,n_00,n);
    std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::push_back
              ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,(value_type *)((long)&decls.field_2 + 8));
    Value::~Value((Value *)((long)&decls.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>::
    operator++(&__end2);
  }
  puVar27 = &switchD_0020b8db::switchdataD_0036dbd0;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/decompiler.cc"
                  ,0x19e,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i,"let ",&local_a1);
    std::allocator<char>::~allocator(&local_a1);
    for (local_a8 = 0; local_a8 < (n->u).field_0.var_count; local_a8 = local_a8 + 1) {
      if (local_a8 != 0) {
        std::__cxx11::string::operator+=((string *)&i,", ");
      }
      TempVarName_abi_cxx11_(&local_c8,this,(n->u).field_0.var_start + local_a8);
      std::__cxx11::string::operator+=((string *)&i,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::operator+=((string *)&i," = ");
    local_d8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&i);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"");
    postfix._M_str = local_e8._M_str;
    postfix._M_len = local_e8._M_len;
    WrapNAry(__return_storage_ptr__,this,
             (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2,
             local_d8,postfix,Assign);
    local_ec = 1;
    std::__cxx11::string::~string((string *)&i);
    break;
  case FlushedVar:
    TempVarName_abi_cxx11_(&local_138,this,(n->u).field_0.var_start);
    local_118 = &local_138;
    local_110 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_139);
    __l_11._M_len = local_110;
    __l_11._M_array = local_118;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_108,__l_11,&local_139);
    Value::Value(__return_storage_ptr__,&local_108,Atomic);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_139);
    local_df8 = (string *)&local_118;
    do {
      local_df8 = local_df8 + -1;
      std::__cxx11::string::~string((string *)local_df8);
    } while (local_df8 != &local_138);
    local_ec = 1;
    break;
  case Statements:
    local_13a = 0;
    memset(&i_1,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1);
    Value::Value(__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i_1,None);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i_1);
    s = (value_type *)0x0;
    while( true ) {
      pvVar5 = s;
      pvVar8 = (value_type *)
               std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&n->children);
      if (pvVar8 <= pvVar5) break;
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_168 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::back(&pvVar11->v);
      pcVar26 = (char *)std::__cxx11::string::back();
      if ((*pcVar26 != '}') && (pcVar26 = (char *)std::__cxx11::string::back(), *pcVar26 != ':')) {
        std::__cxx11::string::operator+=((string *)local_168,';');
      }
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_170._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pvVar11->v);
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,(size_type)s);
      local_178._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pvVar11->v);
      local_180 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               (&__return_storage_ptr__->v);
      local_188 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                               (local_170,local_178,
                                (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )local_180);
      s = (value_type *)&s->field_0x1;
    }
    local_ec = 1;
    local_13a = 1;
    break;
  case EndReturn:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"return ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"");
    postfix_00._M_str = local_1a8._M_str;
    postfix_00._M_len = local_1a8._M_len;
    WrapNAry(__return_storage_ptr__,this,
             (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2,
             local_198,postfix_00,None);
    local_ec = 1;
    break;
  case Decl:
    pAVar1 = this->cur_ast;
    psVar9 = Var::name_abi_cxx11_((n->u).var);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar1->vars_defined,psVar9);
    pmVar10->defined = true;
    psVar9 = Var::name_abi_cxx11_((n->u).var);
    std::__cxx11::string::string((string *)&local_230,(string *)psVar9);
    local_238 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl(&local_210,this,&local_230,local_238);
    std::operator+(&local_1f0,"var ",&local_210);
    local_1d0 = &local_1f0;
    local_1c8 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_239);
    __l_10._M_len = local_1c8;
    __l_10._M_array = local_1d0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,__l_10,&local_239);
    Value::Value(__return_storage_ptr__,&local_1c0,None);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_239);
    local_e18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    do {
      local_e18 = local_e18 + -1;
      std::__cxx11::string::~string((string *)local_e18);
    } while (local_e18 != &local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    local_ec = 1;
    break;
  case DeclInit:
    pAVar1 = this->cur_ast;
    psVar9 = Var::name_abi_cxx11_((n->u).var);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar1->vars_defined,psVar9);
    if ((pmVar10->defined & 1U) == 0) {
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      psVar9 = Var::name_abi_cxx11_((n->u).var);
      std::__cxx11::string::string((string *)&local_310,(string *)psVar9);
      local_318 = Func::GetLocalType(this->cur_func,(n->u).var);
      LocalDecl(&local_2f0,this,&local_310,local_318);
      cat<char[5],std::__cxx11::string,char[4]>
                (&local_2d0,(wabt *)"var ",(char (*) [5])&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37cd5f,in_R8
                );
      local_2b0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2d0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&c_1,"");
      postfix_02._M_str = local_320;
      postfix_02._M_len = (size_t)c_1;
      WrapChild(__return_storage_ptr__,this,pvVar11,local_2b0,postfix_02,None);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      local_ec = 1;
    }
    else {
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      psVar9 = Var::name_abi_cxx11_((n->u).var);
      local_290 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_280 = VarName(this,local_290);
      cat<std::basic_string_view<char,std::char_traits<char>>,char[4]>
                (&local_270,(wabt *)&local_280,
                 (basic_string_view<char,_std::char_traits<char>_> *)0x37cd5f,(char (*) [4])puVar27)
      ;
      local_250 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_270);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"");
      postfix_01._M_str = local_2a0._M_str;
      postfix_01._M_len = local_2a0._M_len;
      WrapChild(__return_storage_ptr__,this,pvVar11,local_250,postfix_01,None);
      std::__cxx11::string::~string((string *)&local_270);
      local_ec = 1;
    }
    break;
  case Expr:
  default:
    puVar27 = &switchD_0020c16e::switchdataD_0036dbf0;
    switch(n->etype) {
    case Binary:
      opcs.field_2._8_8_ = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(n->e);
      local_554 = (((OpcodeExpr<(wabt::ExprType)7> *)opcs.field_2._8_8_)->opcode).enum_;
      OpcodeToToken_abi_cxx11_((string *)&prec,this,(Opcode)local_554);
      local_558 = OtherBin;
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &prec,"*");
      if (((bVar6) ||
          (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&prec,"/"), bVar6)) ||
         (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prec,"%"), bVar6)) {
        local_558 = Multiply;
      }
      else {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prec,"+");
        if ((bVar6) ||
           (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&prec,"-"), bVar6)) {
          local_558 = Add;
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&prec,"&");
          if (((bVar6) ||
              (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&prec,"|"), bVar6)) ||
             (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&prec,"^"), bVar6)) {
            local_558 = Bit;
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&prec,"<<");
            if ((bVar6) ||
               (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&prec,">>"), bVar6)) {
              local_558 = Shift;
            }
          }
        }
      }
      sVar28 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&prec);
      local_560 = sVar28._M_str;
      ce = (OpcodeExpr<(wabt::ExprType)16> *)sVar28._M_len;
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,sVar28,false,local_558);
      local_ec = 1;
      std::__cxx11::string::~string((string *)&prec);
      break;
    case Block:
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      local_810 = pvVar11;
      pBVar20 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(n->e);
      local_850 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&pBVar20->block);
      local_840 = VarName(this,local_850);
      cat<char[7],std::basic_string_view<char,std::char_traits<char>>,char[2]>
                (&local_830,(wabt *)"label ",(char (*) [7])&local_840,
                 (basic_string_view<char,_std::char_traits<char>_> *)":",(char (*) [2])in_R8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pvVar11->v,&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      if ((((args.
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
           (*(int *)&((args.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 3)) &&
          (*(int *)((long)&((args.
                             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) != 8)) &&
         (*(int *)((long)&((args.
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) != 0x1b)) {
        if (*(int *)((long)&((args.
                              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) == 0x16) {
          pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                              ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                               &((args.
                                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->v).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          if (pvVar14 != n) goto LAB_0020d6c8;
        }
        pvVar11 = local_810;
        sVar17 = this->indent_amount;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_860);
        IndentValue(this,pvVar11,sVar17,local_860);
        pvVar11 = local_810;
        local_870._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&local_810->v);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_868,&local_870);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"{",&local_891);
        local_8a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(&pvVar11->v,local_868,&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        std::allocator<char>::~allocator(&local_891);
        pvVar11 = local_810;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c0,"}",(allocator<char> *)((long)&val_1 + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pvVar11->v,&local_8c0);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&val_1 + 7));
      }
LAB_0020d6c8:
      local_810->precedence = Atomic;
      Value::Value(__return_storage_ptr__,local_810);
      local_ec = 1;
      break;
    case Br:
      local_970 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(n->e);
      pcVar26 = "goto ";
      if ((n->u).field_0.var_start == 3) {
        pcVar26 = "continue ";
      }
      psVar9 = Var::name_abi_cxx11_(&local_970->var);
      local_9d8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_9c8 = VarName(this,local_9d8);
      y._M_str = *in_R8;
      y._M_len = (size_t)local_9c8._M_str;
      operator+[abi_cxx11_(&local_9b8,(wabt *)pcVar26,(char *)local_9c8._M_len,y);
      local_998 = &local_9b8;
      local_990 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&bie + 7));
      __l_03._M_len = local_990;
      __l_03._M_array = local_998;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_988,__l_03,(allocator_type *)((long)&bie + 7));
      Value::Value(__return_storage_ptr__,&local_988,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_988);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&bie + 7));
      local_fe0 = (string *)&local_998;
      do {
        local_fe0 = local_fe0 + -1;
        std::__cxx11::string::~string((string *)local_fe0);
      } while (local_fe0 != &local_9b8);
      local_ec = 1;
      break;
    case BrIf:
      jmp = (char *)cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(n->e);
      local_9f0 = "goto";
      if ((n->u).field_0.var_start == 3) {
        local_9f0 = "continue";
      }
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a00,"if (");
      psVar9 = Var::name_abi_cxx11_((Var *)(jmp + 0x40));
      local_a50 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_a40 = VarName(this,local_a50);
      cat<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
                (&local_a30,(wabt *)0x37f708,(char (*) [3])&local_9f0,(char **)0x36dfa4,
                 (char (*) [2])&local_a40,in_R9);
      local_a10 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a30);
      WrapChild(__return_storage_ptr__,this,pvVar11,local_a00,local_a10,None);
      std::__cxx11::string::~string((string *)&local_a30);
      local_ec = 1;
      break;
    case BrTable:
      ts.field_2._8_8_ = cast<wabt::BrTableExpr,wabt::Expr>(n->e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_ba8,"br_table[",(allocator<char> *)((long)&__range3 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      this_01 = (vector<wabt::Var,_std::allocator<wabt::Var>_> *)(ts.field_2._8_8_ + 0x40);
      __end3 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(this_01);
      v = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(this_01);
      while( true ) {
        bVar6 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                    *)&v);
        if (!bVar6) break;
        local_bd0 = __gnu_cxx::
                    __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                    ::operator*(&__end3);
        psVar9 = Var::name_abi_cxx11_(local_bd0);
        sVar28 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
        local_bf0 = sVar28;
        local_be0 = VarName(this,sVar28);
        y_01._M_str = (char *)puVar27;
        y_01._M_len = (size_t)local_be0._M_str;
        operator+=((wabt *)local_ba8,(string *)local_be0._M_len,y_01);
        std::__cxx11::string::operator+=(local_ba8,", ");
        __gnu_cxx::
        __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
        operator++(&__end3);
      }
      std::__cxx11::string::operator+=(local_ba8,"..");
      psVar9 = Var::name_abi_cxx11_((Var *)(ts.field_2._8_8_ + 0x58));
      local_c10 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_c00 = VarName(this,local_c10);
      y_02._M_str = (char *)puVar27;
      y_02._M_len = (size_t)local_c00._M_str;
      operator+=((wabt *)local_ba8,(string *)local_c00._M_len,y_02);
      std::__cxx11::string::operator+=(local_ba8,"](");
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      local_c20 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_ba8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&cme,")");
      postfix_05._M_str = local_c28;
      postfix_05._M_len = (size_t)cme;
      WrapChild(__return_storage_ptr__,this,pvVar11,local_c20,postfix_05,Atomic);
      local_ec = 1;
      std::__cxx11::string::~string(local_ba8);
      break;
    default:
      std::__cxx11::string::string((string *)local_d18);
      local_d1c = Atomic;
      switch(n->etype) {
      case Call:
        pVVar22 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(n->e);
        psVar9 = Var::name_abi_cxx11_(&pVVar22->var);
        std::__cxx11::string::operator=((string *)local_d18,(string *)psVar9);
        break;
      case CallIndirect:
        std::__cxx11::string::operator=((string *)local_d18,"call_indirect");
        break;
      default:
        pcVar26 = GetExprTypeName(n->etype);
        std::__cxx11::string::operator=((string *)local_d18,pcVar26);
        break;
      case Convert:
        pOVar24 = cast<wabt::OpcodeExpr<(wabt::ExprType)18>,wabt::Expr>(n->e);
        local_d64 = (pOVar24->opcode).enum_;
        OpcodeToToken_abi_cxx11_(&local_d60,this,(Opcode)local_d64);
        std::__cxx11::string::operator=((string *)local_d18,(string *)&local_d60);
        std::__cxx11::string::~string((string *)&local_d60);
        break;
      case MemoryCopy:
        std::__cxx11::string::operator=((string *)local_d18,"memory_copy");
        break;
      case MemoryFill:
        std::__cxx11::string::operator=((string *)local_d18,"memory_fill");
        break;
      case MemoryGrow:
        std::__cxx11::string::operator=((string *)local_d18,"memory_grow");
        break;
      case MemorySize:
        std::__cxx11::string::operator=((string *)local_d18,"memory_size");
        break;
      case RefIsNull:
        std::__cxx11::string::operator=((string *)local_d18,"is_null");
        break;
      case ReturnCall:
        pVVar23 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(n->e);
        psVar9 = Var::name_abi_cxx11_(&pVVar23->var);
        std::operator+(&local_d40,"return_call ",psVar9);
        std::__cxx11::string::operator=((string *)local_d18,(string *)&local_d40);
        std::__cxx11::string::~string((string *)&local_d40);
        local_d1c = None;
        break;
      case ReturnCallIndirect:
        std::__cxx11::string::operator=((string *)local_d18,"return_call call_indirect");
        break;
      case Select:
        std::__cxx11::string::operator=((string *)local_d18,"select_if");
        break;
      case Ternary:
        pOVar25 = cast<wabt::OpcodeExpr<(wabt::ExprType)58>,wabt::Expr>(n->e);
        local_d8c = (pOVar25->opcode).enum_;
        OpcodeToToken_abi_cxx11_(&local_d88,this,(Opcode)local_d8c);
        std::__cxx11::string::operator=((string *)local_d18,(string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d88);
      }
      std::operator+(&local_dc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d18,
                     "(");
      local_da0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_dc0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_dd0,")");
      postfix_06._M_str = local_dd0._M_str;
      postfix_06._M_len = local_dd0._M_len;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_da0,postfix_06,local_d1c);
      std::__cxx11::string::~string((string *)&local_dc0);
      local_ec = 1;
      std::__cxx11::string::~string((string *)local_d18);
      break;
    case CodeMetadata:
      c_2.field_2._8_8_ = cast<wabt::CodeMetadataExpr,wabt::Expr>(n->e);
      local_c88 = (char *)(((CodeMetadataExpr *)c_2.field_2._8_8_)->name)._M_len;
      local_c80 = (((CodeMetadataExpr *)c_2.field_2._8_8_)->name)._M_str;
      y_00._M_str = *in_R8;
      y_00._M_len = (size_t)local_c80;
      operator+[abi_cxx11_(&local_c78,(wabt *)"// @metadata.code.",local_c88,y_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c58,
                     &local_c78," ");
      std::__cxx11::string::~string((string *)&local_c78);
      BinaryToString_abi_cxx11_
                (&local_ca8,this,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(c_2.field_2._8_8_ + 0x50)
                );
      std::__cxx11::string::operator+=((string *)local_c58,(string *)&local_ca8);
      std::__cxx11::string::~string((string *)&local_ca8);
      std::__cxx11::string::string((string *)&local_cf0,(string *)local_c58);
      local_cd0 = &local_cf0;
      local_cc8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(name.field_2._M_local_buf + 0xf));
      __l._M_len = local_cc8;
      __l._M_array = local_cd0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_cc0,__l,(allocator_type *)(name.field_2._M_local_buf + 0xf));
      Value::Value(__return_storage_ptr__,&local_cc0,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_cc0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(name.field_2._M_local_buf + 0xf));
      local_1058 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_cd0;
      do {
        local_1058 = local_1058 + -1;
        std::__cxx11::string::~string((string *)local_1058);
      } while (local_1058 != &local_cf0);
      local_ec = 1;
      std::__cxx11::string::~string((string *)local_c58);
      break;
    case Compare:
      local_570 = cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(n->e);
      ue._4_4_ = (local_570->opcode).enum_;
      OpcodeToToken_abi_cxx11_(&local_5a0,this,ue._4_4_);
      local_580 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5a0);
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,local_580,false,Equal);
      std::__cxx11::string::~string((string *)&local_5a0);
      local_ec = 1;
      break;
    case Const:
      pCVar12 = cast<wabt::ConstExpr,wabt::Expr>(n->e);
      local_330 = &pCVar12->const_;
      local_338 = Const::type(local_330);
      EVar7 = Type::operator_cast_to_Enum(&local_338);
      switch(EVar7) {
      case V128:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"V128",(allocator<char> *)((long)&te + 7));
        local_4f8 = &local_518;
        local_4f0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&te + 6));
        __l_05._M_len = local_4f0;
        __l_05._M_array = local_4f8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_4e8,__l_05,(allocator_type *)((long)&te + 6));
        Value::Value(__return_storage_ptr__,&local_4e8,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4e8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&te + 6));
        local_ec0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4f8;
        do {
          local_ec0 = local_ec0 + -1;
          std::__cxx11::string::~string((string *)local_ec0);
        } while (local_ec0 != &local_518);
        std::allocator<char>::~allocator((allocator<char> *)((long)&te + 7));
        local_ec = 1;
        break;
      case F64:
        local_480 = Const::f64_bits(local_330);
        local_478 = Bitcast<double,unsigned_long>(&local_480);
        to_string_abi_cxx11_(&local_4c8,this,local_478);
        local_4a8 = &local_4c8;
        local_4a0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_4c9);
        __l_06._M_len = local_4a0;
        __l_06._M_array = local_4a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_498,__l_06,&local_4c9);
        Value::Value(__return_storage_ptr__,&local_498,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_498);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_4c9);
        local_ea8 = (string *)&local_4a8;
        do {
          local_ea8 = local_ea8 + -1;
          std::__cxx11::string::~string((string *)local_ea8);
        } while (local_ea8 != &local_4c8);
        local_ec = 1;
        break;
      case F32:
        local_3fc = Const::f32_bits(local_330);
        local_3f8 = Bitcast<float,unsigned_int>(&local_3fc);
        to_string_abi_cxx11_(&local_468,this,(double)local_3f8);
        std::operator+(&local_448,&local_468,"f");
        local_428 = &local_448;
        local_420 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&d + 7));
        __l_07._M_len = local_420;
        __l_07._M_array = local_428;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_418,__l_07,(allocator_type *)((long)&d + 7));
        Value::Value(__return_storage_ptr__,&local_418,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_418);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&d + 7));
        local_e90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428;
        do {
          local_e90 = local_e90 + -1;
          std::__cxx11::string::~string((string *)local_e90);
        } while (local_e90 != &local_448);
        std::__cxx11::string::~string((string *)&local_468);
        local_ec = 1;
        break;
      case I64:
        uVar13 = Const::u64(local_330);
        std::__cxx11::to_string((string *)&f,uVar13);
        std::operator+(&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,"L");
        local_3b0 = &local_3d0;
        local_3a8 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_3f1);
        __l_08._M_len = local_3a8;
        __l_08._M_array = local_3b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_3a0,__l_08,&local_3f1);
        Value::Value(__return_storage_ptr__,&local_3a0,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3a0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_3f1);
        local_e78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0;
        do {
          local_e78 = local_e78 + -1;
          std::__cxx11::string::~string((string *)local_e78);
        } while (local_e78 != &local_3d0);
        std::__cxx11::string::~string((string *)&f);
        local_ec = 1;
        break;
      case I32:
        __val = Const::u32(local_330);
        std::__cxx11::to_string(&local_380,__val);
        local_360 = &local_380;
        local_358 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_381);
        __l_09._M_len = local_358;
        __l_09._M_array = local_360;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_350,__l_09,&local_381);
        Value::Value(__return_storage_ptr__,&local_350,Atomic);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_350);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_381);
        local_e60 = (string *)&local_360;
        do {
          local_e60 = local_e60 + -1;
          std::__cxx11::string::~string((string *)local_e60);
        } while (local_e60 != &local_380);
        local_ec = 1;
        break;
      default:
        abort();
      }
      break;
    case Drop:
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      Value::Value(__return_storage_ptr__,pvVar11);
      local_ec = 1;
      break;
    case GlobalGet:
      ve_00 = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(n->e);
      Get<(wabt::ExprType)20>(__return_storage_ptr__,this,ve_00);
      local_ec = 1;
      break;
    case GlobalSet:
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      ve_02 = cast<wabt::VarExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
      Set<(wabt::ExprType)21>(__return_storage_ptr__,this,pvVar11,ve_02);
      local_ec = 1;
      break;
    case If:
      pIVar15 = cast<wabt::IfExpr,wabt::Expr>(n->e);
      thenp = (value_type *)0x0;
      bVar6 = intrusive_list<wabt::Expr>::empty(&pIVar15->false_);
      if (!bVar6) {
        thenp = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,2);
      }
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,1);
      this_00 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      sVar16 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this_00->v);
      bVar6 = true;
      if (sVar16 < 2) {
        sVar16 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&pvVar11->v);
        bVar6 = 1 < sVar16;
      }
      sVar17 = Value::width(this_00);
      sVar18 = Value::width(pvVar11);
      if_start._M_str = (char *)(sVar17 + sVar18);
      if (thenp != (value_type *)0x0) {
        sVar17 = Value::width(thenp);
        if_start._M_str = if_start._M_str + sVar17;
        bVar3 = !bVar6;
        bVar6 = true;
        if (bVar3) {
          sVar16 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&thenp->v);
          bVar6 = 1 < sVar16;
        }
      }
      bVar3 = true;
      if (!bVar6) {
        bVar3 = (char *)this->target_exp_width < if_start._M_str;
      }
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_698,"if (");
        sVar16 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_698);
        local_6a8 = (size_t)local_698;
        local_6a0 = if_start._M_len;
        first_indent_00._M_str = (char *)if_start._M_len;
        first_indent_00._M_len = (size_t)local_698;
        IndentValue(this,this_00,sVar16,first_indent_00);
        pvVar19 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::back(&this_00->v);
        std::__cxx11::string::operator+=((string *)pvVar19,") {");
        sVar17 = this->indent_amount;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6b8);
        IndentValue(this,pvVar11,sVar17,local_6b8);
        local_6c0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pvVar11->v);
        local_6c8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pvVar11->v);
        local_6d0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::
                       back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                 (&this_00->v);
        local_6d8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::
                       move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                 (local_6c0,local_6c8,
                                  (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )local_6d0);
        if (thenp != (value_type *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"} else {",&local_6f9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_00->v,&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::allocator<char>::~allocator(&local_6f9);
          sVar17 = this->indent_amount;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_710);
          IndentValue(this,thenp,sVar17,local_710);
          local_718._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&thenp->v);
          local_720._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&thenp->v);
          local_728 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)std::
                         back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                   (&this_00->v);
          local_730 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)std::
                         move<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                   (local_718,local_720,
                                    (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     )local_728);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"}",(allocator<char> *)(s_1.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->v,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator((allocator<char> *)(s_1.field_2._M_local_buf + 0xf));
        this_00->precedence = If;
        Value::Value(__return_storage_ptr__,this_00);
        local_ec = 1;
      }
      else {
        pvVar19 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this_00->v,0);
        cat<char[5],std::__cxx11::string,char[4]>
                  ((string *)local_778,(wabt *)"if (",(char (*) [5])pvVar19,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") {",in_R8)
        ;
        bVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&pvVar11->v);
        if (!bVar6) {
          pvVar19 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&pvVar11->v,0);
          cat<char[2],std::__cxx11::string,char[2]>
                    (&local_798,(wabt *)0x36dfa4,(char (*) [2])pvVar19,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36dfa4,
                     (char (*) [2])in_R8);
          std::__cxx11::string::operator+=((string *)local_778,(string *)&local_798);
          std::__cxx11::string::~string((string *)&local_798);
        }
        std::__cxx11::string::operator+=((string *)local_778,"}");
        if (thenp != (value_type *)0x0) {
          pvVar19 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&thenp->v,0);
          cat<char[9],std::__cxx11::string,char[3]>
                    (&local_7b8,(wabt *)" else { ",(char (*) [9])pvVar19,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d749,
                     (char (*) [3])in_R8);
          std::__cxx11::string::operator+=((string *)local_778,(string *)&local_7b8);
          std::__cxx11::string::~string((string *)&local_7b8);
        }
        std::__cxx11::string::string((string *)&local_800,(string *)local_778);
        local_7e0 = &local_800;
        local_7d8 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&val + 7));
        __l_04._M_len = local_7d8;
        __l_04._M_array = local_7e0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_7d0,__l_04,(allocator_type *)((long)&val + 7));
        Value::Value(__return_storage_ptr__,&local_7d0,If);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_7d0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&val + 7));
        local_f80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7e0;
        do {
          local_f80 = local_f80 + -1;
          std::__cxx11::string::~string((string *)local_f80);
        } while (local_f80 != &local_800);
        local_ec = 1;
        std::__cxx11::string::~string((string *)local_778);
      }
      break;
    case Load:
      local_620 = cast<wabt::LoadStoreExpr<(wabt::ExprType)23>,wabt::Expr>(n->e);
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
      uVar13 = local_620->offset;
      local_624.enum_ = (local_620->opcode).enum_;
      AVar2 = local_620->align;
      register0x00000000 = Opcode::GetResultType(&local_620->opcode);
      LoadStore(this,pvVar11,pvVar14,uVar13,local_624,AVar2,register0x00000000);
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      Value::Value(__return_storage_ptr__,pvVar11);
      local_ec = 1;
      break;
    case LocalGet:
      ve = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(n->e);
      Get<(wabt::ExprType)24>(__return_storage_ptr__,this,ve);
      local_ec = 1;
      break;
    case LocalSet:
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      ve_01 = cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(n->e);
      Set<(wabt::ExprType)25>(__return_storage_ptr__,this,pvVar11,ve_01);
      local_ec = 1;
      break;
    case LocalTee:
      ve_03 = cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(n->e);
      bVar6 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::empty
                        ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          *)&__range2);
      if (bVar6) {
        Get<(wabt::ExprType)26>(__return_storage_ptr__,this,ve_03);
      }
      else {
        pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                  operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                              *)&__range2,0);
        Set<(wabt::ExprType)26>(__return_storage_ptr__,this,pvVar11,ve_03);
      }
      local_ec = 1;
      break;
    case Loop:
      block = (Block *)std::
                       vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                       operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                   *)&__range2,0);
      pBVar21 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(n->e);
      pBVar4 = block;
      local_8d8 = (string *)&pBVar21->block;
      sVar17 = this->indent_amount;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_8e8);
      first_indent._M_str = local_8e8._M_str;
      first_indent._M_len = local_8e8._M_len;
      IndentValue(this,(Value *)pBVar4,sVar17,first_indent);
      pBVar4 = block;
      local_8f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)block);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_8f0,&local_8f8);
      local_938 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_8d8);
      local_928 = VarName(this,local_938);
      cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
                (&local_918,(wabt *)"loop ",(char (*) [6])&local_928,
                 (basic_string_view<char,_std::char_traits<char>_> *)0x3698d0,
                 (char (*) [3])local_8e8._M_str);
      local_940 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)pBVar4,local_8f0,&local_918);
      std::__cxx11::string::~string((string *)&local_918);
      pBVar4 = block;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"}",(allocator<char> *)((long)&be_1 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pBVar4,&local_960);
      std::__cxx11::string::~string((string *)&local_960);
      std::allocator<char>::~allocator((allocator<char> *)((long)&be_1 + 7));
      *(undefined4 *)((long)&(block->label).field_2 + 8) = 10;
      Value::Value(__return_storage_ptr__,(Value *)block);
      local_ec = 1;
      break;
    case Nop:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"nop",&local_ad9);
      local_ab8 = &local_ad8;
      local_ab0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_ada);
      __l_02._M_len = local_ab0;
      __l_02._M_array = local_ab8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_aa8,__l_02,&local_ada);
      Value::Value(__return_storage_ptr__,&local_aa8,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_aa8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_ada);
      local_1008 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ab8;
      do {
        local_1008 = local_1008 + -1;
        std::__cxx11::string::~string((string *)local_1008);
      } while (local_1008 != &local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
      local_ec = 1;
      break;
    case RefNull:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b78,"null",(allocator<char> *)((long)&bte + 7));
      local_b58 = &local_b78;
      local_b50 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&bte + 6));
      __l_00._M_len = local_b50;
      __l_00._M_array = local_b58;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b48,__l_00,(allocator_type *)((long)&bte + 6));
      Value::Value(__return_storage_ptr__,&local_b48,Atomic);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b48);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&bte + 6));
      local_1038 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b58;
      do {
        local_1038 = local_1038 + -1;
        std::__cxx11::string::~string((string *)local_1038);
      } while (local_1038 != &local_b78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bte + 7));
      local_ec = 1;
      break;
    case Rethrow:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a80,"rethrow ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a90,"");
      postfix_04._M_str = local_a90._M_str;
      postfix_04._M_len = local_a90._M_len;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_a80,postfix_04,None);
      local_ec = 1;
      break;
    case Return:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a60,"return ")
      ;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a70,"");
      postfix_03._M_str = local_a70._M_str;
      postfix_03._M_len = local_a70._M_len;
      WrapNAry(__return_storage_ptr__,this,
               (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
               &__range2,local_a60,postfix_03,None);
      local_ec = 1;
      break;
    case Store:
      local_638 = cast<wabt::LoadStoreExpr<(wabt::ExprType)49>,wabt::Expr>(n->e);
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      pvVar14 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[](&n->children,0);
      uVar13 = local_638->offset;
      local_63c.enum_ = (local_638->opcode).enum_;
      AVar2 = local_638->align;
      local_644 = Opcode::GetParamType2(&local_638->opcode);
      LoadStore(this,pvVar11,pvVar14,uVar13,local_63c,AVar2,local_644);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&ife,"=");
      WrapBinary(__return_storage_ptr__,this,
                 (vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)
                 &__range2,_ife,true,Assign);
      local_ec = 1;
      break;
    case Unary:
      local_5b0 = cast<wabt::OpcodeExpr<(wabt::ExprType)63>,wabt::Expr>(n->e);
      pvVar11 = std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
                operator[]((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            *)&__range2,0);
      local_604 = (local_5b0->opcode).enum_;
      OpcodeToToken_abi_cxx11_(&local_600,this,(Opcode)local_604);
      std::operator+(&local_5e0,&local_600,"(");
      local_5c0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&le,")");
      sVar28._M_str = local_610;
      sVar28._M_len = (size_t)le;
      WrapChild(__return_storage_ptr__,this,pvVar11,local_5c0,sVar28,Atomic);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      local_ec = 1;
      break;
    case Last:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,"unreachable",&local_b29);
      local_b08 = &local_b28;
      local_b00 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_b2a);
      __l_01._M_len = local_b00;
      __l_01._M_array = local_b08;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_af8,__l_01,&local_b2a);
      Value::Value(__return_storage_ptr__,&local_af8,None);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_af8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_b2a);
      local_1020 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b08;
      do {
        local_1020 = local_1020 + -1;
        std::__cxx11::string::~string((string *)local_1020);
      } while (local_1020 != &local_b28);
      std::allocator<char>::~allocator(&local_b29);
      local_ec = 1;
    }
  }
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector
            ((vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *)&__range2)
  ;
  return __return_storage_ptr__;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) {
            decls += ", ";
          }
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value{{TempVarName(n.u.var_start)}, Precedence::Atomic};
      }
      case NodeType::Statements: {
        Value stats{{}, Precedence::None};
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') {
            s += ';';
          }
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{{"var " + LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var))},
                     Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(args[0],
                           cat("var ",
                               LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var)),
                               " = "),
                           "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, opcs, false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
        return WrapBinary(args, OpcodeToToken(ce.opcode), false,
                          Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        // BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, "=", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value* elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = std::string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(),
                      std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") {");
          if (!thenp.v.empty())
            s += cat(" ", thenp.v[0], " ");
          s += "}";
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
            cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements &&
            parent->etype != ExprType::Block &&
            parent->etype != ExprType::Loop &&
            (parent->etype != ExprType::If || &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (",
                         cat(") ", jmp, " ", VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto& v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      case ExprType::CodeMetadata: {
        auto cme = cast<CodeMetadataExpr>(n.e);
        std::string c = "// @metadata.code." + cme->name + " ";
        c += BinaryToString(cme->data);
        return Value{{std::move(c)}, Precedence::None};
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }